

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

void prvTidyEmFromI(TidyDocImpl *doc,Node *node)

{
  Dict *pDVar1;
  TidyTagId tid;
  
  if (node != (Node *)0x0) {
    do {
      pDVar1 = node->tag;
      if ((pDVar1 != (Dict *)0x0) &&
         ((tid = TidyTag_EM, pDVar1->id == TidyTag_I ||
          ((pDVar1 != (Dict *)0x0 && (tid = TidyTag_STRONG, pDVar1->id == TidyTag_B)))))) {
        RenameElem(doc,node,tid);
      }
      if (node->content != (Node *)0x0) {
        prvTidyEmFromI(doc,node->content);
      }
      node = node->next;
    } while (node != (Node *)0x0);
  }
  return;
}

Assistant:

void TY_(EmFromI)( TidyDocImpl* doc, Node* node )
{
    while (node)
    {
        if ( nodeIsI(node) )
            RenameElem( doc, node, TidyTag_EM );
        else if ( nodeIsB(node) )
            RenameElem( doc, node, TidyTag_STRONG );

        if ( node->content )
            TY_(EmFromI)( doc, node->content );

        node = node->next;
    }
}